

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *left_child_res,
          vec<16U,_float> *right_child_res,vq_node *parent_node)

{
  float *pfVar1;
  float *pfVar2;
  uint *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  uint i_4;
  int iVar9;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar10;
  ulong uVar11;
  long lVar12;
  undefined4 *puVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long lVar16;
  undefined1 *puVar17;
  undefined4 *puVar18;
  uint x;
  long lVar19;
  float fVar20;
  uint uVar21;
  uint uVar24;
  double dVar22;
  double dVar23;
  uint uVar25;
  uint uVar26;
  float fVar27;
  vec<16U,_float> axis;
  vec<16U,_float> result_3;
  vec<16U,_float> left_child;
  vec<16U,_float> prev_axis;
  vec<16U,_float> right_child;
  matrix<16U,_16U,_float> covar;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  float local_538 [2];
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478 [18];
  undefined1 local_430 [4];
  undefined1 local_42c [60];
  undefined4 local_3f0 [240];
  
  uVar11 = (ulong)(parent_node->m_vectors).m_size;
  if (uVar11 == 2) {
    ppVar10 = (this->m_training_vecs).m_p + *(parent_node->m_vectors).m_p;
    if (ppVar10 != (pair<crnlib::vec<16U,_float>,_unsigned_int> *)left_child_res) {
      lVar12 = 0;
      do {
        left_child_res->m_s[lVar12] = (ppVar10->first).m_s[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
    }
    ppVar10 = (this->m_training_vecs).m_p + (parent_node->m_vectors).m_p[1];
    if (ppVar10 != (pair<crnlib::vec<16U,_float>,_unsigned_int> *)right_child_res) {
      lVar12 = 0;
      do {
        right_child_res->m_s[lVar12] = (ppVar10->first).m_s[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
    }
  }
  else {
    memset(local_430,0,0x400);
    if (uVar11 != 0) {
      puVar3 = (parent_node->m_vectors).m_p;
      ppVar10 = (this->m_training_vecs).m_p;
      uVar14 = 0;
      do {
        uVar21 = puVar3[uVar14];
        lVar12 = 0;
        do {
          pfVar1 = ppVar10[uVar21].first.m_s + lVar12;
          fVar20 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar4 = pfVar1[3];
          pfVar2 = (parent_node->m_centroid).m_s + lVar12;
          fVar5 = pfVar2[1];
          fVar6 = pfVar2[2];
          fVar7 = pfVar2[3];
          lVar19 = lVar12 * 4;
          *(float *)((long)&local_578 + lVar19) = *pfVar1 - *pfVar2;
          *(float *)((long)&local_578 + lVar19 + 4) = fVar20 - fVar5;
          *(float *)((long)&uStack_570 + lVar19) = fVar27 - fVar6;
          *(float *)((long)&uStack_570 + lVar19 + 4) = fVar4 - fVar7;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        fVar20 = (float)ppVar10[uVar21].second;
        lVar12 = 0;
        do {
          lVar19 = lVar12 * 4;
          fVar27 = *(float *)((long)&local_578 + lVar19 + 4);
          fVar4 = *(float *)((long)&uStack_570 + lVar19);
          fVar5 = *(float *)((long)&uStack_570 + lVar19 + 4);
          lVar16 = lVar12 * 4;
          *(float *)((long)&local_4b8 + lVar16) = *(float *)((long)&local_578 + lVar19) * fVar20;
          *(float *)((long)&local_4b8 + lVar16 + 4) = fVar27 * fVar20;
          *(float *)((long)&uStack_4b0 + lVar16) = fVar4 * fVar20;
          *(float *)((long)&uStack_4b0 + lVar16 + 4) = fVar5 * fVar20;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        lVar12 = 0;
        puVar15 = &local_4b8;
        puVar17 = local_430;
        do {
          fVar20 = *(float *)((long)&local_578 + lVar12 * 4);
          lVar19 = -0x10;
          do {
            *(float *)(puVar17 + lVar19 * 4 + 0x40) =
                 *(float *)((long)puVar15 + lVar19 * 4 + 0x40) * fVar20 +
                 *(float *)(puVar17 + lVar19 * 4 + 0x40);
            lVar19 = lVar19 + 1;
          } while (lVar12 + lVar19 != 0);
          lVar12 = lVar12 + 1;
          puVar17 = puVar17 + 0x44;
          puVar15 = (undefined8 *)((long)puVar15 + 4);
        } while (lVar12 != 0x10);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar11);
    }
    uVar11 = parent_node->m_total_weight;
    puVar17 = local_430;
    lVar12 = 0;
    do {
      lVar19 = -0x10;
      do {
        *(float *)(puVar17 + lVar19 * 4 + 0x40) =
             *(float *)(puVar17 + lVar19 * 4 + 0x40) * (1.0 / (float)uVar11);
        lVar19 = lVar19 + 1;
      } while (lVar12 + lVar19 != 0);
      lVar12 = lVar12 + 1;
      puVar17 = puVar17 + 0x44;
    } while (lVar12 != 0x10);
    puVar17 = local_42c;
    puVar13 = local_3f0;
    lVar12 = 0;
    do {
      lVar19 = lVar12 + 1;
      lVar16 = -0xf;
      puVar18 = puVar13;
      do {
        *puVar18 = *(undefined4 *)(puVar17 + lVar16 * 4 + 0x3c);
        lVar16 = lVar16 + 1;
        puVar18 = puVar18 + 0x10;
      } while (lVar12 + lVar16 != 0);
      puVar17 = puVar17 + 0x44;
      puVar13 = puVar13 + 0x11;
      lVar12 = lVar19;
    } while (lVar19 != 0xf);
    uVar21 = 0;
    uVar24 = 1;
    uVar25 = 2;
    uVar26 = 3;
    lVar12 = 0;
    do {
      lVar19 = lVar12 * 4;
      *(float *)((long)&local_578 + lVar19) =
           (((float)(uVar21 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar21 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      *(float *)((long)&local_578 + lVar19 + 4) =
           (((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar24 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      *(float *)((long)&uStack_570 + lVar19) =
           (((float)(uVar25 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar25 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      *(float *)((long)&uStack_570 + lVar19 + 4) =
           (((float)(uVar26 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar26 & 0xffff | 0x4b000000)) * 0.06666667 * 0.5 + 0.75;
      lVar12 = lVar12 + 4;
      uVar21 = uVar21 + 4;
      uVar24 = uVar24 + 4;
      uVar25 = uVar25 + 4;
      uVar26 = uVar26 + 4;
    } while (lVar12 != 0x10);
    local_488 = local_548;
    uStack_480 = uStack_540;
    local_498 = local_558;
    uStack_490 = uStack_550;
    local_4a8 = local_568;
    uStack_4a0 = uStack_560;
    local_4b8 = local_578;
    uStack_4b0 = uStack_570;
    iVar9 = 0;
    do {
      lVar12 = 0;
      fVar20 = 0.0;
      puVar17 = local_430;
      do {
        fVar27 = 0.0;
        lVar19 = 0;
        do {
          fVar27 = fVar27 + *(float *)((long)&local_578 + lVar19 * 4) *
                            *(float *)(puVar17 + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        *(float *)((long)&local_4f8 + lVar12 * 4) = fVar27;
        if (fVar20 <= ABS(fVar27)) {
          fVar20 = ABS(fVar27);
        }
        lVar12 = lVar12 + 1;
        puVar17 = puVar17 + 0x40;
      } while (lVar12 != 0x10);
      if ((fVar20 != 0.0) || (NAN(fVar20))) {
        fVar20 = 1.0 / fVar20;
        lVar12 = 0;
        do {
          lVar19 = lVar12 * 4;
          fVar27 = *(float *)((long)&local_4f8 + lVar19 + 4);
          fVar4 = *(float *)((long)&uStack_4f0 + lVar19);
          fVar5 = *(float *)((long)&uStack_4f0 + lVar19 + 4);
          lVar16 = lVar12 * 4;
          *(float *)((long)&local_4f8 + lVar16) = *(float *)((long)&local_4f8 + lVar19) * fVar20;
          *(float *)((long)&local_4f8 + lVar16 + 4) = fVar27 * fVar20;
          *(float *)((long)&uStack_4f0 + lVar16) = fVar4 * fVar20;
          *(float *)((long)&uStack_4f0 + lVar16 + 4) = fVar5 * fVar20;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
      }
      lVar12 = 0;
      do {
        lVar19 = lVar12 * 4;
        fVar20 = *(float *)((long)&local_4b8 + lVar19 + 4);
        fVar27 = *(float *)((long)&uStack_4b0 + lVar19);
        fVar4 = *(float *)((long)&uStack_4b0 + lVar19 + 4);
        lVar16 = lVar12 * 4;
        fVar5 = *(float *)((long)&local_4f8 + lVar16 + 4);
        fVar6 = *(float *)((long)&uStack_4f0 + lVar16);
        fVar7 = *(float *)((long)&uStack_4f0 + lVar16 + 4);
        local_478[lVar12] =
             *(float *)((long)&local_4b8 + lVar19) - *(float *)((long)&local_4f8 + lVar16);
        local_478[lVar12 + 1] = fVar20 - fVar5;
        local_478[lVar12 + 2] = fVar27 - fVar6;
        local_478[lVar12 + 3] = fVar4 - fVar7;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      local_488 = local_548;
      uStack_480 = uStack_540;
      local_498 = local_558;
      uStack_490 = uStack_550;
      local_4a8 = local_568;
      uStack_4a0 = uStack_560;
      local_4b8 = local_578;
      uStack_4b0 = uStack_570;
      local_578 = local_4f8;
      uVar8 = local_578;
      uStack_570 = uStack_4f0;
      local_568 = local_4e8;
      uStack_560 = uStack_4e0;
      local_558 = local_4d8;
      uStack_550 = uStack_4d0;
      local_548 = local_4c8;
      uStack_540 = uStack_4c0;
      fVar20 = local_478[0] * local_478[0];
      lVar12 = 1;
      do {
        fVar20 = fVar20 + local_478[lVar12] * local_478[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x10);
    } while ((0.0025 <= fVar20) && (iVar9 = iVar9 + 1, iVar9 != 10));
    local_578._0_4_ = (float)local_4f8;
    dVar22 = (double)((float)local_578 * (float)local_578);
    lVar12 = 1;
    do {
      fVar20 = *(float *)((long)&local_578 + lVar12 * 4);
      dVar22 = dVar22 + (double)(fVar20 * fVar20);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    local_578 = uVar8;
    if ((dVar22 != 0.0) || (NAN(dVar22))) {
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      fVar20 = (float)(1.0 / dVar22);
      lVar12 = 0;
      do {
        lVar19 = lVar12 * 4;
        fVar27 = *(float *)((long)&local_578 + lVar19 + 4);
        fVar4 = *(float *)((long)&uStack_570 + lVar19);
        fVar5 = *(float *)((long)&uStack_570 + lVar19 + 4);
        lVar16 = lVar12 * 4;
        *(float *)((long)&local_578 + lVar16) = *(float *)((long)&local_578 + lVar19) * fVar20;
        *(float *)((long)&local_578 + lVar16 + 4) = fVar27 * fVar20;
        *(float *)((long)&uStack_570 + lVar16) = fVar4 * fVar20;
        *(float *)((long)&uStack_570 + lVar16 + 4) = fVar5 * fVar20;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
    }
    dVar22 = 0.0;
    local_4c8 = 0;
    uStack_4c0 = 0;
    local_4d8 = 0;
    uStack_4d0 = 0;
    local_4e8 = 0;
    uStack_4e0 = 0;
    local_4f8 = 0;
    uStack_4f0 = 0;
    local_478[0xc] = 0.0;
    local_478[0xd] = 0.0;
    local_478[0xe] = 0.0;
    local_478[0xf] = 0.0;
    local_478[8] = 0.0;
    local_478[9] = 0.0;
    local_478[10] = 0.0;
    local_478[0xb] = 0.0;
    local_478[4] = 0.0;
    local_478[5] = 0.0;
    local_478[6] = 0.0;
    local_478[7] = 0.0;
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    local_478[3] = 0.0;
    uVar11 = (ulong)(parent_node->m_vectors).m_size;
    dVar23 = 0.0;
    if (uVar11 != 0) {
      puVar3 = (parent_node->m_vectors).m_p;
      ppVar10 = (this->m_training_vecs).m_p;
      uVar14 = 0;
      dVar22 = 0.0;
      dVar23 = 0.0;
      do {
        uVar21 = puVar3[uVar14];
        uVar24 = ppVar10[uVar21].second;
        lVar12 = 0;
        do {
          pfVar1 = ppVar10[uVar21].first.m_s + lVar12;
          fVar20 = pfVar1[1];
          fVar27 = pfVar1[2];
          fVar4 = pfVar1[3];
          pfVar2 = (parent_node->m_centroid).m_s + lVar12;
          fVar5 = pfVar2[1];
          fVar6 = pfVar2[2];
          fVar7 = pfVar2[3];
          local_538[lVar12] = *pfVar1 - *pfVar2;
          local_538[lVar12 + 1] = fVar20 - fVar5;
          *(float *)((long)&uStack_530 + lVar12 * 4) = fVar27 - fVar6;
          *(float *)((long)&uStack_530 + lVar12 * 4 + 4) = fVar4 - fVar7;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        fVar20 = local_538[0] * (float)local_578;
        lVar12 = 1;
        do {
          fVar20 = fVar20 + local_538[lVar12] * *(float *)((long)&local_578 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x10);
        fVar27 = (float)uVar24;
        if (0.0 <= fVar20) {
          lVar12 = 0;
          do {
            pfVar1 = ppVar10[uVar21].first.m_s + lVar12;
            fVar20 = pfVar1[1];
            fVar4 = pfVar1[2];
            fVar5 = pfVar1[3];
            local_538[lVar12] = *pfVar1 * fVar27;
            local_538[lVar12 + 1] = fVar20 * fVar27;
            *(float *)((long)&uStack_530 + lVar12 * 4) = fVar4 * fVar27;
            *(float *)((long)&uStack_530 + lVar12 * 4 + 4) = fVar5 * fVar27;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x10);
          lVar12 = 0;
          do {
            fVar20 = local_538[lVar12 + 1];
            fVar27 = *(float *)((long)&uStack_530 + lVar12 * 4);
            fVar4 = *(float *)((long)&uStack_530 + lVar12 * 4 + 4);
            local_478[lVar12] = local_478[lVar12] + local_538[lVar12];
            local_478[lVar12 + 1] = local_478[lVar12 + 1] + fVar20;
            local_478[lVar12 + 2] = local_478[lVar12 + 2] + fVar27;
            local_478[lVar12 + 3] = local_478[lVar12 + 3] + fVar4;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x10);
          dVar23 = dVar23 + (double)uVar24;
        }
        else {
          lVar12 = 0;
          do {
            pfVar1 = ppVar10[uVar21].first.m_s + lVar12;
            fVar20 = pfVar1[1];
            fVar4 = pfVar1[2];
            fVar5 = pfVar1[3];
            local_538[lVar12] = *pfVar1 * fVar27;
            local_538[lVar12 + 1] = fVar20 * fVar27;
            *(float *)((long)&uStack_530 + lVar12 * 4) = fVar4 * fVar27;
            *(float *)((long)&uStack_530 + lVar12 * 4 + 4) = fVar5 * fVar27;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x10);
          lVar12 = 0;
          do {
            fVar20 = local_538[lVar12 + 1];
            fVar27 = *(float *)((long)&uStack_530 + lVar12 * 4);
            fVar4 = *(float *)((long)&uStack_530 + lVar12 * 4 + 4);
            lVar19 = lVar12 * 4;
            fVar5 = *(float *)((long)&local_4f8 + lVar19 + 4);
            fVar6 = *(float *)((long)&uStack_4f0 + lVar19);
            fVar7 = *(float *)((long)&uStack_4f0 + lVar19 + 4);
            lVar16 = lVar12 * 4;
            *(float *)((long)&local_4f8 + lVar16) =
                 *(float *)((long)&local_4f8 + lVar19) + local_538[lVar12];
            *(float *)((long)&local_4f8 + lVar16 + 4) = fVar5 + fVar20;
            *(float *)((long)&uStack_4f0 + lVar16) = fVar6 + fVar27;
            *(float *)((long)&uStack_4f0 + lVar16 + 4) = fVar7 + fVar4;
            lVar12 = lVar12 + 4;
          } while (lVar12 != 0x10);
          dVar22 = dVar22 + (double)uVar24;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar11);
    }
    if ((dVar22 <= 0.0) || (dVar23 <= 0.0)) {
      compute_split_estimate(this,left_child_res,right_child_res,parent_node);
    }
    else {
      fVar20 = (float)(1.0 / dVar22);
      lVar12 = 0;
      do {
        lVar19 = lVar12 * 4;
        fVar27 = *(float *)((long)&local_4f8 + lVar19 + 4);
        fVar4 = *(float *)((long)&uStack_4f0 + lVar19);
        fVar5 = *(float *)((long)&uStack_4f0 + lVar19 + 4);
        local_538[lVar12] = *(float *)((long)&local_4f8 + lVar19) * fVar20;
        local_538[lVar12 + 1] = fVar27 * fVar20;
        *(float *)((long)&uStack_530 + lVar12 * 4) = fVar4 * fVar20;
        *(float *)((long)&uStack_530 + lVar12 * 4 + 4) = fVar5 * fVar20;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      *(undefined8 *)(left_child_res->m_s + 0xc) = local_508;
      *(undefined8 *)(left_child_res->m_s + 0xe) = uStack_500;
      *(undefined8 *)(left_child_res->m_s + 8) = local_518;
      *(undefined8 *)(left_child_res->m_s + 10) = uStack_510;
      *(undefined8 *)(left_child_res->m_s + 4) = local_528;
      *(undefined8 *)(left_child_res->m_s + 6) = uStack_520;
      *(ulong *)left_child_res->m_s = CONCAT44(local_538[1],local_538[0]);
      *(undefined8 *)(left_child_res->m_s + 2) = uStack_530;
      fVar20 = (float)(1.0 / dVar23);
      lVar12 = 0;
      do {
        fVar27 = local_478[lVar12 + 1];
        fVar4 = local_478[lVar12 + 2];
        fVar5 = local_478[lVar12 + 3];
        local_538[lVar12] = local_478[lVar12] * fVar20;
        local_538[lVar12 + 1] = fVar27 * fVar20;
        *(float *)((long)&uStack_530 + lVar12 * 4) = fVar4 * fVar20;
        *(float *)((long)&uStack_530 + lVar12 * 4 + 4) = fVar5 * fVar20;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      *(undefined8 *)(right_child_res->m_s + 0xc) = local_508;
      *(undefined8 *)(right_child_res->m_s + 0xe) = uStack_500;
      *(undefined8 *)(right_child_res->m_s + 8) = local_518;
      *(undefined8 *)(right_child_res->m_s + 10) = uStack_510;
      *(undefined8 *)(right_child_res->m_s + 4) = local_528;
      *(undefined8 *)(right_child_res->m_s + 6) = uStack_520;
      *(ulong *)right_child_res->m_s = CONCAT44(local_538[1],local_538[0]);
      *(undefined8 *)(right_child_res->m_s + 2) = uStack_530;
    }
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }